

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O1

void __thiscall
TimerHeap::addTimer(TimerHeap *this,int id,long timeout_ms,timeoutCallBack *callBack)

{
  long *plVar1;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  element_type *peVar4;
  _Manager_type p_Var5;
  pointer psVar6;
  pointer psVar7;
  int iVar8;
  int iVar9;
  mapped_type *pmVar10;
  ulong uVar11;
  __node_base_ptr p_Var12;
  __node_base_ptr p_Var13;
  long lVar14;
  element_type *this_00;
  long lVar15;
  bool bVar16;
  timeType_ local_88;
  _Any_data local_78;
  _Manager_type local_68;
  _Invoker_type p_Stack_60;
  undefined1 local_50 [8];
  TimerPtr timer;
  int local_34 [2];
  int id_local;
  
  local_34[0] = id;
  if (this->timeFlag_ == true) {
    clock_gettime(1,(timespec *)local_50);
    (this->timeCache_).sec = (long)local_50;
    (this->timeCache_).msec =
         (long)timer.super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr / 1000000;
    this->timeFlag_ = false;
  }
  lVar15 = timeout_ms + (this->timeCache_).msec;
  lVar14 = lVar15 / 1000 + (this->timeCache_).sec;
  uVar2 = (this->timerMap_)._M_h._M_bucket_count;
  uVar11 = (ulong)(long)local_34[0] % uVar2;
  p_Var12 = (this->timerMap_)._M_h._M_buckets[uVar11];
  p_Var13 = (__node_base_ptr)0x0;
  if ((p_Var12 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var12->_M_nxt, p_Var13 = p_Var12, local_34[0] != *(int *)&p_Var12->_M_nxt[1]._M_nxt
     )) {
    while (p_Var12 = p_Var3, p_Var3 = p_Var12->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var13 = (__node_base_ptr)0x0;
      if (((ulong)(long)*(int *)&p_Var3[1]._M_nxt % uVar2 != uVar11) ||
         (p_Var13 = p_Var12, local_34[0] == *(int *)&p_Var3[1]._M_nxt)) goto LAB_0010d6b6;
    }
    p_Var13 = (__node_base_ptr)0x0;
  }
LAB_0010d6b6:
  lVar15 = lVar15 % 1000;
  timer.super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this->timerMap_;
  if ((p_Var13 != (__node_base_ptr)0x0) && (p_Var13->_M_nxt != (_Hash_node_base *)0x0)) {
    pmVar10 = std::__detail::
              _Map_base<int,_std::pair<const_int,_std::weak_ptr<Timer>_>,_std::allocator<std::pair<const_int,_std::weak_ptr<Timer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<int,_std::pair<const_int,_std::weak_ptr<Timer>_>,_std::allocator<std::pair<const_int,_std::weak_ptr<Timer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)timer.super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi,local_34);
    this_00 = (element_type *)
              (pmVar10->super___weak_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (this_00 != (element_type *)0x0) {
      iVar9 = (int)(this_00->timeout_).msec;
      do {
        if (iVar9 == 0) {
          this_00 = (element_type *)0x0;
          break;
        }
        plVar1 = &(this_00->timeout_).msec;
        LOCK();
        iVar8 = (int)*plVar1;
        bVar16 = iVar9 == iVar8;
        if (bVar16) {
          *(int *)plVar1 = iVar9 + 1;
          iVar8 = iVar9;
        }
        iVar9 = iVar8;
        UNLOCK();
      } while (!bVar16);
    }
    if (this_00 == (element_type *)0x0) {
      bVar16 = true;
    }
    else {
      bVar16 = (int)(this_00->timeout_).msec == 0;
    }
    peVar4 = (pmVar10->super___weak_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((!(bool)(peVar4 == (element_type *)0x0 | bVar16)) && (peVar4->heapIndex_ != -1)) {
      (peVar4->timeout_).sec = lVar14;
      (peVar4->timeout_).msec = lVar15;
      std::function<void_()>::operator=(&peVar4->callBack_,callBack);
      modify(this,(long)peVar4->heapIndex_);
      timer.super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
      goto joined_r0x0010d89b;
    }
    if (this_00 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
    }
  }
  local_50 = (undefined1  [8])operator_new(0x38);
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = (_Manager_type)0x0;
  p_Stack_60 = callBack->_M_invoker;
  p_Var5 = (callBack->super__Function_base)._M_manager;
  if (p_Var5 != (_Manager_type)0x0) {
    local_78._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(callBack->super__Function_base)._M_functor;
    local_78._8_8_ = *(undefined8 *)((long)&(callBack->super__Function_base)._M_functor + 8);
    (callBack->super__Function_base)._M_manager = (_Manager_type)0x0;
    callBack->_M_invoker = (_Invoker_type)0x0;
    local_68 = p_Var5;
  }
  psVar6 = (this->timerHeap_).
           super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  psVar7 = (this->timerHeap_).
           super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (((Timer *)local_50)->timeout_).sec = lVar14;
  (((Timer *)local_50)->timeout_).msec = lVar15;
  *(undefined8 *)&(((Timer *)local_50)->callBack_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(((Timer *)local_50)->callBack_).super__Function_base._M_functor + 8) = 0;
  (((Timer *)local_50)->callBack_).super__Function_base._M_manager = (_Manager_type)0x0;
  (((Timer *)local_50)->callBack_)._M_invoker = p_Stack_60;
  if (local_68 != (_Manager_type)0x0) {
    *(void **)&(((Timer *)local_50)->callBack_).super__Function_base._M_functor =
         local_78._M_unused._M_object;
    *(undefined8 *)((long)&(((Timer *)local_50)->callBack_).super__Function_base._M_functor + 8) =
         local_78._8_8_;
    (((Timer *)local_50)->callBack_).super__Function_base._M_manager = local_68;
    local_68 = (_Manager_type)0x0;
    p_Stack_60 = (_Invoker_type)0x0;
  }
  ((Timer *)local_50)->heapIndex_ = (int)((ulong)((long)psVar6 - (long)psVar7) >> 4);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Timer*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&timer,(Timer *)local_50);
  if (local_68 != (_Manager_type)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  pmVar10 = std::__detail::
            _Map_base<int,_std::pair<const_int,_std::weak_ptr<Timer>_>,_std::allocator<std::pair<const_int,_std::weak_ptr<Timer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<int,_std::pair<const_int,_std::weak_ptr<Timer>_>,_std::allocator<std::pair<const_int,_std::weak_ptr<Timer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)timer.super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi,local_34);
  (pmVar10->super___weak_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)local_50;
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(pmVar10->super___weak_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&timer);
  std::vector<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>::push_back
            (&this->timerHeap_,(value_type *)local_50);
  upHeap(this,((long)(this->timerHeap_).
                     super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->timerHeap_).
                     super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) - 1);
  if ((undefined1  [8])
      (((this->timerHeap_).
        super__Vector_base<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>._M_impl
        .super__Vector_impl_data._M_start)->super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr == local_50) {
    local_88.sec = ((timeType_ *)local_50)->sec;
    local_88.msec = ((timeType_ *)local_50)->msec;
    setTime(this,&this->timeCache_,&local_88);
  }
joined_r0x0010d89b:
  if (timer.super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               timer.super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void TimerHeap::addTimer(int id, long timeout_ms, timeoutCallBack callBack) {
    if (timeFlag_) {
        struct timespec tv;
        clock_gettime(CLOCK_MONOTONIC, &tv);
        timeCache_.sec = tv.tv_sec;
        timeCache_.msec = tv.tv_nsec / 1000 / 1000;
        timeFlag_ = false;
    }
    Timer::timeType_ timeout(timeCache_);
    timeout.sec += (timeCache_.msec + timeout_ms) / 1000;
    timeout.msec = (timeCache_.msec + timeout_ms) % 1000;
    if (timerMap_.find(id) != timerMap_.end()) {
        TimerPtr tmp(timerMap_[id].lock());
        if (tmp && tmp->heapIndex_ != -1) {
            tmp->timeout_ = std::move(timeout);
            tmp->callBack_ = std::move(callBack);
            modify(tmp->heapIndex_);
            return;
        }
    }
    TimerPtr timer(new Timer(std::move(timeout), std::move(callBack), timerHeap_.size()));
    timerMap_[id] = timer;
    timerHeap_.push_back(timer);
    upHeap(timerHeap_.size() - 1);
    if (timerHeap_.front() == timer) { 
        setTime(timeCache_, timer->getTimeout());
    }
}